

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O1

DdNode * Abc_NodeConeBdd(DdManager *dd,DdNode **pbVars,Abc_Obj_t *pRoot,Vec_Ptr_t *vLeaves,
                        Vec_Ptr_t *vVisited)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  DdNode *n;
  Abc_Obj_t *local_30;
  
  local_30 = pRoot;
  Abc_NodeConeCollect(&local_30,1,vLeaves,vVisited,0);
  if (0 < vLeaves->nSize) {
    lVar4 = 0;
    do {
      *(DdNode **)((long)vLeaves->pArray[lVar4] + 0x40) = pbVars[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 < vLeaves->nSize);
  }
  if (vVisited->nSize < 1) {
    n = (DdNode *)0x0;
  }
  else {
    lVar4 = 0;
    do {
      plVar2 = (long *)vVisited->pArray[lVar4];
      uVar1 = *(uint *)((long)plVar2 + 0x14);
      if ((uVar1 & 0xf) == 2) {
        __assert_fail("!Abc_ObjIsPi(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcReconv.c"
                      ,0x204,
                      "DdNode *Abc_NodeConeBdd(DdManager *, DdNode **, Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                     );
      }
      lVar3 = *(long *)(*(long *)(*plVar2 + 0x20) + 8);
      n = Cudd_bddAnd(dd,(DdNode *)
                         ((ulong)(uVar1 >> 10 & 1) ^
                         *(ulong *)(*(long *)(lVar3 + (long)*(int *)plVar2[4] * 8) + 0x40)),
                      (DdNode *)
                      ((ulong)(uVar1 >> 0xb & 1) ^
                      *(ulong *)(*(long *)(lVar3 + (long)((int *)plVar2[4])[1] * 8) + 0x40)));
      Cudd_Ref(n);
      plVar2[8] = (long)n;
      lVar4 = lVar4 + 1;
    } while (lVar4 < vVisited->nSize);
  }
  if (n == (DdNode *)0x0) {
    __assert_fail("bFunc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcReconv.c"
                  ,0x20a,
                  "DdNode *Abc_NodeConeBdd(DdManager *, DdNode **, Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  Cudd_Ref(n);
  if (0 < vVisited->nSize) {
    lVar4 = 0;
    do {
      Cudd_RecursiveDeref(dd,*(DdNode **)((long)vVisited->pArray[lVar4] + 0x40));
      lVar4 = lVar4 + 1;
    } while (lVar4 < vVisited->nSize);
  }
  Cudd_Deref(n);
  return n;
}

Assistant:

DdNode * Abc_NodeConeBdd( DdManager * dd, DdNode ** pbVars, Abc_Obj_t * pRoot, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vVisited )
{
    Abc_Obj_t * pNode;
    DdNode * bFunc0, * bFunc1, * bFunc = NULL;
    int i;
    // get the nodes in the cut without fanins in the DFS order
    Abc_NodeConeCollect( &pRoot, 1, vLeaves, vVisited, 0 );
    // set the elementary BDDs
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pNode, i )
        pNode->pCopy = (Abc_Obj_t *)pbVars[i];
    // compute the BDDs for the collected nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vVisited, pNode, i )
    {
        assert( !Abc_ObjIsPi(pNode) );
        bFunc0 = Cudd_NotCond( Abc_ObjFanin0(pNode)->pCopy, (int)Abc_ObjFaninC0(pNode) );
        bFunc1 = Cudd_NotCond( Abc_ObjFanin1(pNode)->pCopy, (int)Abc_ObjFaninC1(pNode) );
        bFunc  = Cudd_bddAnd( dd, bFunc0, bFunc1 );    Cudd_Ref( bFunc );
        pNode->pCopy = (Abc_Obj_t *)bFunc;
    }
    assert(bFunc);
    Cudd_Ref( bFunc );
    // dereference the intermediate ones
    Vec_PtrForEachEntry( Abc_Obj_t *, vVisited, pNode, i )
        Cudd_RecursiveDeref( dd, (DdNode *)pNode->pCopy );
    Cudd_Deref( bFunc );
    return bFunc;
}